

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::TypeSpecializeFloatUnary
          (GlobOpt *this,Instr **pInstr,Value *src1Val,Value **pDstVal,bool skipDst)

{
  StackSym *sym;
  code *pcVar1;
  bool bVar2;
  OpCode opcode;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  char16 *pcVar5;
  StackSym *sym_00;
  Value *valToTransfer;
  OpCode OVar6;
  char local_34;
  
  OVar6 = (*pInstr)->m_opcode;
  opcode = OVar6;
  if (src1Val == (Value *)0x0) {
LAB_00436efb:
    bVar2 = OpCodeAttr::IsInlineBuiltIn(opcode);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2936,
                         "(src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))"
                         ,
                         "src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode)"
                        );
      if (!bVar2) goto LAB_0043726e;
      *puVar3 = 0;
    }
  }
  else {
    bVar2 = ValueType::IsLikelyNumber(&src1Val->valueInfo->super_ValueType);
    if (!bVar2) {
      opcode = (*pInstr)->m_opcode;
      goto LAB_00436efb;
    }
  }
  if ((this->field_0xf5 & 0x20) == 0) {
LAB_00436f63:
    valToTransfer = (Value *)0x0;
  }
  else {
    bVar2 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
    local_34 = skipDst;
    if (bVar2) {
      valToTransfer = (Value *)0x0;
    }
    else if (OVar6 - 0xe < 2) {
LAB_00436fda:
      bVar2 = IR::Opnd::IsRegOpnd((*pInstr)->m_src1);
      if (bVar2) {
        pRVar4 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
        bVar2 = GlobOptBlockData::IsFloat64TypeSpecialized
                          (&this->currentBlock->globOptData,&pRVar4->m_sym->super_Sym);
        if (!bVar2) goto LAB_00436f63;
      }
      valToTransfer = (Value *)0x0;
      if ((*pInstr)->m_opcode == Ld_A) {
        valToTransfer = src1Val;
      }
    }
    else {
      valToTransfer = (Value *)0x0;
      if (OVar6 != Neg_A) {
        if (OVar6 != Conv_Num) {
          if (OVar6 != Ld_A) {
            if (((OVar6 == StElemI_A) || (OVar6 == StElemI_A_Strict)) || (OVar6 == StElemC)) {
              bVar2 = TypeSpecializeStElem(this,pInstr,src1Val,(Value **)(ulong)(OVar6 - 0xe));
              return bVar2;
            }
            if (OVar6 != ArgOut_A_InlineBuiltIn) goto LAB_0043715c;
            local_34 = '\x01';
          }
          goto LAB_00436fda;
        }
        if (src1Val == (Value *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x295c,"(src1Val)","src1Val");
          if (!bVar2) {
LAB_0043726e:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
        bVar2 = ValueType::IsNumber(&src1Val->valueInfo->super_ValueType);
        OVar6 = Ld_A;
        valToTransfer = src1Val;
        if (!bVar2) {
          pRVar4 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
          sym = pRVar4->m_sym;
          sym_00 = IR::Opnd::GetStackSym((*pInstr)->m_dst);
          valToTransfer = NewGenericValue(this,(ValueType)0x108,&sym_00->super_Sym);
          bVar2 = GlobOptBlockData::IsFloat64TypeSpecialized
                            (&this->currentBlock->globOptData,&sym->super_Sym);
          if (!bVar2) {
            pRVar4 = IR::Opnd::AsRegOpnd((*pInstr)->m_dst);
            pRVar4->field_0x18 = pRVar4->field_0x18 | 4;
          }
        }
      }
    }
    ToFloat64(this,*pInstr,(*pInstr)->m_src1,this->currentBlock,src1Val,(IndirOpnd *)0x0,
              BailOutPrimitiveButString);
    if (((local_34 == '\0') && ((*pInstr)->m_dst != (Opnd *)0x0)) &&
       (TypeSpecializeFloatDst(this,*pInstr,valToTransfer,src1Val,(Value *)0x0,pDstVal),
       this->prePassLoop == (Loop *)0x0)) {
      (*pInstr)->m_opcode = OVar6;
    }
    sourceContextId = Func::GetSourceContextId(this->func);
    functionId = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,sourceContextId,functionId);
    if (bVar2) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Type specialized to FLOAT: ");
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,FloatTypeSpecPhase);
    valToTransfer = (Value *)&DAT_00000001;
    if (bVar2) {
      Output::Print(L"Type specialized to FLOAT: ");
      pcVar5 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
      Output::Print(L"%s \n",pcVar5);
    }
  }
LAB_0043715c:
  return SUB81(valToTransfer,0);
}

Assistant:

bool
GlobOpt::TypeSpecializeFloatUnary(IR::Instr **pInstr, Value *src1Val, Value **pDstVal, bool skipDst /* = false */)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *src1;
    IR::Opnd *dst;
    Js::OpCode opcode = instr->m_opcode;
    Value *valueToTransfer = nullptr;

    Assert(src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode));

    if (!this->DoFloatTypeSpec())
    {
        return false;
    }

    // For inline built-ins we need to do type specialization. Check upfront to avoid duplicating same case labels.
    if (!OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        switch (opcode)
        {
        case Js::OpCode::ArgOut_A_InlineBuiltIn:
            skipDst = true;
            // fall-through

        case Js::OpCode::Ld_A:
        case Js::OpCode::BrTrue_A:
        case Js::OpCode::BrFalse_A:
            if (instr->GetSrc1()->IsRegOpnd())
            {
                StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                if (CurrentBlockData()->IsFloat64TypeSpecialized(sym) == false)
                {
                    // Type specializing an Ld_A isn't worth it, unless the src
                    // is already type specialized
                    return false;
                }
            }
            if (instr->m_opcode == Js::OpCode::Ld_A)
            {
                valueToTransfer = src1Val;
            }
            break;
        case Js::OpCode::Neg_A:
            break;

        case Js::OpCode::Conv_Num:
            Assert(src1Val);
            opcode = Js::OpCode::Ld_A;
            valueToTransfer = src1Val;
            if (!src1Val->GetValueInfo()->IsNumber())
            {
                StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                valueToTransfer = NewGenericValue(ValueType::Float, instr->GetDst()->GetStackSym());
                if (CurrentBlockData()->IsFloat64TypeSpecialized(sym) == false)
                {
                    // Set the dst as a nonDeadStore. We want to keep the Ld_A to prevent the FromVar from
                    // being dead-stored, as it could cause implicit calls.
                    dst = instr->GetDst();
                    dst->AsRegOpnd()->m_dontDeadStore = true;
                }
            }
            break;

        case Js::OpCode::StElemI_A:
        case Js::OpCode::StElemI_A_Strict:
        case Js::OpCode::StElemC:
            return TypeSpecializeStElem(pInstr, src1Val, pDstVal);

        default:
            return false;
        }
    }

    // Make sure the srcs are specialized
    src1 = instr->GetSrc1();

    // Use original val when calling toFloat64 as this is what we'll use to try hoisting the fromVar if we're in a loop.
    this->ToFloat64(instr, src1, this->currentBlock, src1Val, nullptr, IR::BailOutPrimitiveButString);

    if (!skipDst)
    {
        dst = instr->GetDst();
        if (dst)
        {
            this->TypeSpecializeFloatDst(instr, valueToTransfer, src1Val, nullptr, pDstVal);
            if (!this->IsLoopPrePass())
            {
                instr->m_opcode = opcode;
            }
        }
    }

    GOPT_TRACE_INSTR(instr, _u("Type specialized to FLOAT: "));

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FloatTypeSpecPhase))
    {
        Output::Print(_u("Type specialized to FLOAT: "));
        Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    return true;
}